

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls_preset_coding_parameters.h
# Opt level: O3

bool charls::is_valid(jpegls_pc_parameters *pc_parameters,int32_t maximum_component_value,
                     int32_t near_lossless,jpegls_pc_parameters *validated_parameters)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  jpegls_pc_parameters default_parameters;
  jpegls_pc_parameters local_2c;
  
  if (maximum_component_value - 0x10000U < 0xffff0003) {
    __assert_fail("maximum_component_value >= 3 && maximum_component_value <= std::numeric_limits<uint16_t>::max()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                  ,0x51,
                  "bool charls::is_valid(const jpegls_pc_parameters &, const int32_t, const int32_t, jpegls_pc_parameters *)"
                 );
  }
  uVar5 = pc_parameters->maximum_sample_value;
  if (((uVar5 == 0) ||
      (bVar1 = (int)uVar5 <= maximum_component_value, maximum_component_value = uVar5,
      bVar1 && 0 < (int)uVar5)) &&
     ((iVar3 = pc_parameters->threshold1, iVar3 == 0 ||
      (iVar3 <= maximum_component_value && near_lossless < iVar3)))) {
    compute_default(&local_2c,maximum_component_value,near_lossless);
    iVar3 = pc_parameters->threshold2;
    iVar2 = pc_parameters->threshold1;
    if (pc_parameters->threshold1 == 0) {
      iVar2 = local_2c.threshold1;
    }
    if ((iVar3 == 0) || (iVar3 <= maximum_component_value && iVar2 <= iVar3)) {
      if (iVar3 == 0) {
        iVar3 = local_2c.threshold2;
      }
      iVar4 = pc_parameters->threshold3;
      if ((iVar4 == 0) || (iVar4 <= maximum_component_value && iVar3 <= iVar4)) {
        uVar5 = pc_parameters->reset_value;
        if (uVar5 != 0) {
          uVar6 = 0xff;
          if (0xff < (uint)maximum_component_value) {
            uVar6 = maximum_component_value;
          }
          if ((int)uVar5 < 3) {
            return false;
          }
          if (uVar6 < uVar5) {
            return false;
          }
        }
        if (validated_parameters == (jpegls_pc_parameters *)0x0) {
          return true;
        }
        validated_parameters->maximum_sample_value = maximum_component_value;
        validated_parameters->threshold1 = iVar2;
        validated_parameters->threshold2 = iVar3;
        if (iVar4 == 0) {
          iVar4 = local_2c.threshold3;
        }
        validated_parameters->threshold3 = iVar4;
        if (uVar5 == 0) {
          uVar5 = local_2c.reset_value;
        }
        validated_parameters->reset_value = uVar5;
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool is_valid(const jpegls_pc_parameters& pc_parameters, const int32_t maximum_component_value,
                     const int32_t near_lossless, jpegls_pc_parameters* validated_parameters = nullptr) noexcept
{
    ASSERT(maximum_component_value >= 3 && maximum_component_value <= std::numeric_limits<uint16_t>::max());

    // ISO/IEC 14495-1, C.2.4.1.1, Table C.1 defines the valid JPEG-LS preset coding parameters values.
    if (pc_parameters.maximum_sample_value != 0 &&
        (pc_parameters.maximum_sample_value < 1 || pc_parameters.maximum_sample_value > maximum_component_value))
        return false;

    const int32_t maximum_sample_value{pc_parameters.maximum_sample_value != 0 ? pc_parameters.maximum_sample_value
                                                                               : maximum_component_value};
    if (pc_parameters.threshold1 != 0 &&
        (pc_parameters.threshold1 < near_lossless + 1 || pc_parameters.threshold1 > maximum_sample_value))
        return false;

    const jpegls_pc_parameters default_parameters{compute_default(maximum_sample_value, near_lossless)};
    const int32_t threshold1{pc_parameters.threshold1 != 0 ? pc_parameters.threshold1 : default_parameters.threshold1};
    if (pc_parameters.threshold2 != 0 &&
        (pc_parameters.threshold2 < threshold1 || pc_parameters.threshold2 > maximum_sample_value))
        return false;

    const int32_t threshold2{pc_parameters.threshold2 != 0 ? pc_parameters.threshold2 : default_parameters.threshold2};
    if (pc_parameters.threshold3 != 0 &&
        (pc_parameters.threshold3 < threshold2 || pc_parameters.threshold3 > maximum_sample_value))
        return false;

    if (pc_parameters.reset_value != 0 &&
        (pc_parameters.reset_value < 3 || pc_parameters.reset_value > std::max(255, maximum_sample_value)))
        return false;

    if (validated_parameters)
    {
        validated_parameters->maximum_sample_value = maximum_sample_value;
        validated_parameters->threshold1 =
            pc_parameters.threshold1 != 0 ? pc_parameters.threshold1 : default_parameters.threshold1;
        validated_parameters->threshold2 =
            pc_parameters.threshold2 != 0 ? pc_parameters.threshold2 : default_parameters.threshold2;
        validated_parameters->threshold3 =
            pc_parameters.threshold3 != 0 ? pc_parameters.threshold3 : default_parameters.threshold3;
        validated_parameters->reset_value =
            pc_parameters.reset_value != 0 ? pc_parameters.reset_value : default_parameters.reset_value;
    }

    return true;
}